

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

GLFWbool waitForAnyEvent(double *timeout)

{
  long lVar1;
  int iVar2;
  GLFWbool GVar3;
  nfds_t unaff_retaddr;
  pollfd *in_stack_00000008;
  int i;
  pollfd fds [3];
  nfds_t count;
  undefined1 *local_50;
  int local_44;
  undefined4 local_38;
  undefined2 local_34;
  ushort local_32;
  int local_30;
  undefined2 local_2c;
  ushort local_2a;
  undefined1 auStack_28 [8];
  undefined1 auStack_20 [8];
  ulong local_18;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_18 = 2;
  local_38 = *(undefined4 *)(_glfw.x11.display + 0x10);
  local_34 = 1;
  local_32 = 0;
  local_30 = _glfw.x11.emptyEventPipe[0];
  local_2c = 1;
  local_2a = 0;
  local_50 = auStack_28;
  do {
    memset(local_50,0,8);
    local_50 = local_50 + 8;
  } while (local_50 != auStack_20);
  if (0 < _glfw.linjs.inotify) {
    lVar1 = local_18 * 2;
    local_18 = local_18 + 1;
    *(ulong *)(&local_38 + lVar1) = (ulong)CONCAT24(1,_glfw.linjs.inotify);
  }
  while( true ) {
    iVar2 = XPending(_glfw.x11.display);
    if (iVar2 != 0) {
      return 1;
    }
    GVar3 = waitForData(in_stack_00000008,unaff_retaddr,
                        (double *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    if (GVar3 == 0) break;
    for (local_44 = 1; (ulong)(long)local_44 < local_18; local_44 = local_44 + 1) {
      if (((&local_32)[(long)local_44 * 4] & 1) != 0) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static GLFWbool waitForAnyEvent(double* timeout)
{
    nfds_t count = 2;
    struct pollfd fds[3] =
    {
        { ConnectionNumber(_glfw.x11.display), POLLIN },
        { _glfw.x11.emptyEventPipe[0], POLLIN }
    };

#if defined(__linux__)
    if (_glfw.linjs.inotify > 0)
        fds[count++] = (struct pollfd) { _glfw.linjs.inotify, POLLIN };
#endif

    while (!XPending(_glfw.x11.display))
    {
        if (!waitForData(fds, count, timeout))
            return GLFW_FALSE;

        for (int i = 1; i < count; i++)
        {
            if (fds[i].revents & POLLIN)
                return GLFW_TRUE;
        }
    }

    return GLFW_TRUE;
}